

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

void Abc_MergeSort(int *pInput,int nSize)

{
  int *pOutBeg;
  
  if (nSize < 2) {
    return;
  }
  pOutBeg = (int *)malloc((ulong)(uint)nSize * 4);
  Abc_Sort_rec(pInput,pInput + (uint)nSize,pOutBeg);
  free(pOutBeg);
  return;
}

Assistant:

void Abc_MergeSort( int * pInput, int nSize )
{
    int * pOutput;
    if ( nSize < 2 )
        return;
    pOutput = (int *) malloc( sizeof(int) * nSize );
    Abc_Sort_rec( pInput, pInput + nSize, pOutput );
    free( pOutput );
}